

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsRectItem::paint
          (QGraphicsRectItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  QGraphicsItemPrivate *pQVar1;
  
  pQVar1 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  QPainter::setPen((QPen *)painter);
  QPainter::setBrush((QBrush *)painter);
  QPainter::drawRects((QRectF *)painter,(int)pQVar1 + 0x1a8);
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) == 0) {
    return;
  }
  qt_graphicsItem_highlightSelected((QGraphicsItem *)this,painter,option);
  return;
}

Assistant:

void QGraphicsRectItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_D(QGraphicsRectItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    painter->drawRect(d->rect);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}